

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyboard.cpp
# Opt level: O0

char event_to_ascii(uint8_t scancode,uint8_t modifiers)

{
  uint8_t modifiers_local;
  uint8_t scancode_local;
  char local_1;
  
  switch(scancode) {
  case '\x01':
    local_1 = '\x1b';
    break;
  case '\x02':
    local_1 = -0x7b;
    break;
  case '\x03':
    local_1 = -0x7a;
    break;
  case '\x04':
    local_1 = -0x79;
    break;
  case '\x05':
    local_1 = -0x78;
    break;
  case '\x06':
    local_1 = -0x77;
    break;
  case '\a':
    local_1 = -0x76;
    break;
  case '\b':
    local_1 = -0x75;
    break;
  case '\t':
    local_1 = -0x74;
    break;
  case '\n':
    local_1 = '`';
    if ((modifiers & 1) != 0) {
      local_1 = '~';
    }
    break;
  case '\v':
    local_1 = '1';
    if ((modifiers & 1) != 0) {
      local_1 = '!';
    }
    break;
  case '\f':
    local_1 = '2';
    if ((modifiers & 1) != 0) {
      local_1 = '@';
    }
    break;
  case '\r':
    local_1 = '3';
    if ((modifiers & 1) != 0) {
      local_1 = '#';
    }
    break;
  case '\x0e':
    local_1 = '4';
    if ((modifiers & 1) != 0) {
      local_1 = '$';
    }
    break;
  case '\x0f':
    local_1 = '5';
    if ((modifiers & 1) != 0) {
      local_1 = '%';
    }
    break;
  case '\x10':
    local_1 = '6';
    if ((modifiers & 1) != 0) {
      local_1 = '^';
    }
    break;
  case '\x11':
    local_1 = '7';
    if ((modifiers & 1) != 0) {
      local_1 = '&';
    }
    break;
  case '\x12':
    local_1 = '8';
    if ((modifiers & 1) != 0) {
      local_1 = '*';
    }
    break;
  case '\x13':
    if ((modifiers & 1) == 0) {
      local_1 = '9';
      if ((modifiers & 2) != 0) {
        local_1 = '\x12';
      }
    }
    else {
      local_1 = '(';
    }
    break;
  case '\x14':
    if ((modifiers & 1) == 0) {
      local_1 = '0';
      if ((modifiers & 2) != 0) {
        local_1 = -0x6e;
      }
    }
    else {
      local_1 = ')';
    }
    break;
  case '\x15':
    local_1 = '-';
    if ((modifiers & 1) != 0) {
      local_1 = '_';
    }
    break;
  case '\x16':
    local_1 = '=';
    if ((modifiers & 1) != 0) {
      local_1 = '+';
    }
    break;
  case '\x17':
    local_1 = '\b';
    break;
  case '\x18':
    local_1 = ' ';
    break;
  case '\x19':
    local_1 = 'q';
    if ((modifiers & 1) != 0) {
      local_1 = 'Q';
    }
    break;
  case '\x1a':
    local_1 = 'w';
    if ((modifiers & 1) != 0) {
      local_1 = 'W';
    }
    break;
  case '\x1b':
    local_1 = 'e';
    if ((modifiers & 1) != 0) {
      local_1 = 'E';
    }
    break;
  case '\x1c':
    local_1 = 'r';
    if ((modifiers & 1) != 0) {
      local_1 = 'R';
    }
    break;
  case '\x1d':
    local_1 = 't';
    if ((modifiers & 1) != 0) {
      local_1 = 'T';
    }
    break;
  case '\x1e':
    local_1 = 'y';
    if ((modifiers & 1) != 0) {
      local_1 = 'Y';
    }
    break;
  case '\x1f':
    local_1 = 'u';
    if ((modifiers & 1) != 0) {
      local_1 = 'U';
    }
    break;
  case ' ':
    local_1 = 'i';
    if ((modifiers & 1) != 0) {
      local_1 = 'I';
    }
    break;
  case '!':
    local_1 = 'o';
    if ((modifiers & 1) != 0) {
      local_1 = 'O';
    }
    break;
  case '\"':
    local_1 = 'p';
    if ((modifiers & 1) != 0) {
      local_1 = 'P';
    }
    break;
  case '#':
    local_1 = '[';
    if ((modifiers & 1) != 0) {
      local_1 = '{';
    }
    break;
  case '$':
    local_1 = ']';
    if ((modifiers & 1) != 0) {
      local_1 = '}';
    }
    break;
  case '%':
    local_1 = '\n';
    break;
  case '&':
    local_1 = 'a';
    if ((modifiers & 1) != 0) {
      local_1 = 'A';
    }
    break;
  case '\'':
    local_1 = 's';
    if ((modifiers & 1) != 0) {
      local_1 = 'S';
    }
    break;
  case '(':
    local_1 = 'd';
    if ((modifiers & 1) != 0) {
      local_1 = 'D';
    }
    break;
  case ')':
    local_1 = 'f';
    if ((modifiers & 1) != 0) {
      local_1 = 'F';
    }
    break;
  case '*':
    local_1 = 'g';
    if ((modifiers & 1) != 0) {
      local_1 = 'G';
    }
    break;
  case '+':
    local_1 = 'h';
    if ((modifiers & 1) != 0) {
      local_1 = 'H';
    }
    break;
  case ',':
    local_1 = 'j';
    if ((modifiers & 1) != 0) {
      local_1 = 'J';
    }
    break;
  case '-':
    local_1 = 'k';
    if ((modifiers & 1) != 0) {
      local_1 = 'K';
    }
    break;
  case '.':
    local_1 = 'l';
    if ((modifiers & 1) != 0) {
      local_1 = 'L';
    }
    break;
  case '/':
    local_1 = ';';
    if ((modifiers & 1) != 0) {
      local_1 = ':';
    }
    break;
  case '0':
    local_1 = '\'';
    if ((modifiers & 1) != 0) {
      local_1 = '\"';
    }
    break;
  case '1':
    local_1 = '\\';
    if ((modifiers & 1) != 0) {
      local_1 = '|';
    }
    break;
  default:
    local_1 = '\0';
    break;
  case '3':
    local_1 = 'z';
    if ((modifiers & 1) != 0) {
      local_1 = 'Z';
    }
    break;
  case '4':
    local_1 = 'x';
    if ((modifiers & 1) != 0) {
      local_1 = 'X';
    }
    break;
  case '5':
    local_1 = 'c';
    if ((modifiers & 1) != 0) {
      local_1 = 'C';
    }
    break;
  case '6':
    local_1 = 'v';
    if ((modifiers & 1) != 0) {
      local_1 = 'V';
    }
    break;
  case '7':
    local_1 = 'b';
    if ((modifiers & 1) != 0) {
      local_1 = 'B';
    }
    break;
  case '8':
    local_1 = 'n';
    if ((modifiers & 1) != 0) {
      local_1 = 'N';
    }
    break;
  case '9':
    local_1 = 'm';
    if ((modifiers & 1) != 0) {
      local_1 = 'M';
    }
    break;
  case ':':
    local_1 = ',';
    if ((modifiers & 1) != 0) {
      local_1 = '<';
    }
    break;
  case ';':
    local_1 = '.';
    if ((modifiers & 1) != 0) {
      local_1 = '>';
    }
    break;
  case '<':
    local_1 = '/';
    if ((modifiers & 1) != 0) {
      local_1 = '?';
    }
    break;
  case '?':
    local_1 = ' ';
    break;
  case 'A':
    local_1 = -99;
    break;
  case 'B':
    local_1 = -0x6f;
    break;
  case 'C':
    local_1 = '\x11';
    break;
  case 'D':
    local_1 = '\x1d';
  }
  return local_1;
}

Assistant:

inline char event_to_ascii(uint8_t scancode, uint8_t modifiers)
{
	using namespace E64;
	
	switch (scancode) {
		case SCANCODE_ESCAPE: return ASCII_ESCAPE;
		case SCANCODE_F1:     return ASCII_F1;
		case SCANCODE_F2:     return ASCII_F2;
		case SCANCODE_F3:     return ASCII_F3;
		case SCANCODE_F4:     return ASCII_F4;
		case SCANCODE_F5:     return ASCII_F5;
		case SCANCODE_F6:     return ASCII_F6;
		case SCANCODE_F7:     return ASCII_F7;
		case SCANCODE_F8:     return ASCII_F8;
		case SCANCODE_GRAVE:  return (modifiers & SHIFT_PRESSED) ? ASCII_TILDE : ASCII_GRAVE;
		case SCANCODE_1:      return (modifiers & SHIFT_PRESSED) ? ASCII_EXCL_MARK : ASCII_1;
		case SCANCODE_2:      return (modifiers & SHIFT_PRESSED) ? ASCII_AT : ASCII_2;
		case SCANCODE_3:      return (modifiers & SHIFT_PRESSED) ? ASCII_NUMBER : ASCII_3;
		case SCANCODE_4:      return (modifiers & SHIFT_PRESSED) ? ASCII_DOLLAR : ASCII_4;
		case SCANCODE_5:      return (modifiers & SHIFT_PRESSED) ? ASCII_PERCENT : ASCII_5;
		case SCANCODE_6:      return (modifiers & SHIFT_PRESSED) ? ASCII_CARET : ASCII_6;
		case SCANCODE_7:      return (modifiers & SHIFT_PRESSED) ? ASCII_AMPERSAND : ASCII_7;
		case SCANCODE_8:      return (modifiers & SHIFT_PRESSED) ? ASCII_ASTERISK : ASCII_8;
		case SCANCODE_9:      return (modifiers & SHIFT_PRESSED) ? ASCII_OPEN_PAR : ((modifiers & CTRL_PRESSED) ? ASCII_REVERSE_ON : ASCII_9);
		case SCANCODE_0:      return (modifiers & SHIFT_PRESSED) ? ASCII_CLOSE_PAR : ((modifiers & CTRL_PRESSED) ? ASCII_REVERSE_OFF : ASCII_0);
		case SCANCODE_MINUS:  return (modifiers & SHIFT_PRESSED) ? ASCII_UNDERSCORE : ASCII_HYPHEN;
		case SCANCODE_EQUALS: return (modifiers & SHIFT_PRESSED) ? ASCII_PLUS : ASCII_EQUALS;
		case SCANCODE_BACKSPACE: return ASCII_BACKSPACE;
		case SCANCODE_TAB:    return ASCII_SPACE;	// TODO: temp hack to make things work
		case SCANCODE_Q:      return (modifiers & SHIFT_PRESSED) ? ASCII_Q : ASCII_q;
		case SCANCODE_W:      return (modifiers & SHIFT_PRESSED) ? ASCII_W : ASCII_w;
		case SCANCODE_E:      return (modifiers & SHIFT_PRESSED) ? ASCII_E : ASCII_e;
		case SCANCODE_R:      return (modifiers & SHIFT_PRESSED) ? ASCII_R : ASCII_r;
		case SCANCODE_T:      return (modifiers & SHIFT_PRESSED) ? ASCII_T : ASCII_t;
		case SCANCODE_Y:      return (modifiers & SHIFT_PRESSED) ? ASCII_Y : ASCII_y;
		case SCANCODE_U:      return (modifiers & SHIFT_PRESSED) ? ASCII_U : ASCII_u;
		case SCANCODE_I:      return (modifiers & SHIFT_PRESSED) ? ASCII_I : ASCII_i;
		case SCANCODE_O:      return (modifiers & SHIFT_PRESSED) ? ASCII_O : ASCII_o;
		case SCANCODE_P:      return (modifiers & SHIFT_PRESSED) ? ASCII_P : ASCII_p;
		case SCANCODE_LEFTBRACKET: return (modifiers & SHIFT_PRESSED) ? ASCII_OPEN_BRACE : ASCII_OPEN_BRACK;
		case SCANCODE_RIGHTBRACKET: return (modifiers & SHIFT_PRESSED) ? ASCII_CLOSE_BRACE : ASCII_CLOSE_BRACK;
		case SCANCODE_RETURN: return ASCII_LF;
		case SCANCODE_A:      return (modifiers & SHIFT_PRESSED) ? ASCII_A : ASCII_a;
		case SCANCODE_S:      return (modifiers & SHIFT_PRESSED) ? ASCII_S : ASCII_s;
		case SCANCODE_D:      return (modifiers & SHIFT_PRESSED) ? ASCII_D : ASCII_d;
		case SCANCODE_F:      return (modifiers & SHIFT_PRESSED) ? ASCII_F : ASCII_f;
		case SCANCODE_G:      return (modifiers & SHIFT_PRESSED) ? ASCII_G : ASCII_g;
		case SCANCODE_H:      return (modifiers & SHIFT_PRESSED) ? ASCII_H : ASCII_h;
		case SCANCODE_J:      return (modifiers & SHIFT_PRESSED) ? ASCII_J : ASCII_j;
		case SCANCODE_K:      return (modifiers & SHIFT_PRESSED) ? ASCII_K : ASCII_k;
		case SCANCODE_L:      return (modifiers & SHIFT_PRESSED) ? ASCII_L : ASCII_l;
		case SCANCODE_SEMICOLON: return (modifiers & SHIFT_PRESSED) ? ASCII_COLON : ASCII_SEMI_COLON;
		case SCANCODE_APOSTROPHE: return (modifiers & SHIFT_PRESSED) ? ASCII_DOUBLE_QUOTES : ASCII_SINGLE_QUOTE;
		case SCANCODE_BACKSLASH: return (modifiers & SHIFT_PRESSED) ? ASCII_VERT_BAR : ASCII_BACKSLASH;
		case SCANCODE_Z:      return (modifiers & SHIFT_PRESSED) ? ASCII_Z : ASCII_z;
		case SCANCODE_X:      return (modifiers & SHIFT_PRESSED) ? ASCII_X : ASCII_x;
		case SCANCODE_C:      return (modifiers & SHIFT_PRESSED) ? ASCII_C : ASCII_c;
		case SCANCODE_V:      return (modifiers & SHIFT_PRESSED) ? ASCII_V : ASCII_v;
		case SCANCODE_B:      return (modifiers & SHIFT_PRESSED) ? ASCII_B : ASCII_b;
		case SCANCODE_N:      return (modifiers & SHIFT_PRESSED) ? ASCII_N : ASCII_n;
		case SCANCODE_M:      return (modifiers & SHIFT_PRESSED) ? ASCII_M : ASCII_m;
		case SCANCODE_COMMA:  return (modifiers & SHIFT_PRESSED) ? ASCII_LESS : ASCII_COMMA;
		case SCANCODE_PERIOD: return (modifiers & SHIFT_PRESSED) ? ASCII_GREATER : ASCII_PERIOD;
		case SCANCODE_SLASH:  return (modifiers & SHIFT_PRESSED) ? ASCII_QUESTION_M : ASCII_SLASH;
		case SCANCODE_SPACE:  return ASCII_SPACE;
		case SCANCODE_LEFT:   return ASCII_CURSOR_LEFT;
		case SCANCODE_UP:     return ASCII_CURSOR_UP;
		case SCANCODE_DOWN:   return ASCII_CURSOR_DOWN;
		case SCANCODE_RIGHT:  return ASCII_CURSOR_RIGHT;
	}
	return ASCII_NULL;
}